

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDX_AB_Y(CPU *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t address;
  CPU *this_local;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  uVar1 = ReadByte(this,uVar2 + this->Y);
  this->X = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->X == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->X & 0x80) != 0 && -1 < (int)(this->X & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDX_AB_Y()
{
    cycles = 4;
    uint16_t address = GetWord();
    X = ReadByte(address + Y);
    Z = (X == 0);
    N = (X & 0b10000000) > 0;
}